

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
                 *column,Column_settings *colSettings)

{
  Column_support *this_00;
  ID_index IVar1;
  Field_operators *pFVar2;
  
  IVar1 = (column->super_Chain_column_option).pivot_;
  this->super_Column_dimension_option =
       (Column_dimension_option)(column->super_Column_dimension_option).dim_;
  (this->super_Chain_column_option).pivot_ = IVar1;
  (this->super_Chain_column_option).pairedColumn_ =
       (column->super_Chain_column_option).pairedColumn_;
  pFVar2 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar2 = column->operators_;
  }
  this->operators_ = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  this->entryPool_ = &colSettings->entryConstructor;
  this_00 = &this->column_;
  (this->column_).super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)this_00;
  (this->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)this_00;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)this_00,&(column->column_).super_type,(New_cloner)colSettings,(Delete_disposer)this)
  ;
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Intrusive_list_column& column,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor)),
      column_()
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  column_.clone_from(column.column_, New_cloner(entryPool_), Delete_disposer(this));
}